

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O0

void __thiscall LSL_STD<TTA>::FirstScan(LSL_STD<TTA> *this)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  uchar *puVar9;
  int ak;
  int eak;
  int erk;
  int a;
  int ea;
  int er1;
  int er0;
  int j1;
  int j0;
  int er_2;
  uint *RLC_r_1;
  uint *ER_r_prev;
  uint *ERA_r_prev;
  uint *ERA_r_1;
  int r_1;
  int er_1;
  uint *ERA_r;
  int c;
  int er;
  int b;
  int f;
  int x1;
  int x0;
  uint *RLC_r;
  uint *ER_r;
  uchar *img_r;
  int r;
  int cols;
  int rows;
  LSL_STD<TTA> *this_local;
  
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  iVar3 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  for (img_r._4_4_ = 0; img_r._4_4_ < iVar2; img_r._4_4_ = img_r._4_4_ + 1) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_r._4_4_);
    puVar4 = (this->ER).prows[img_r._4_4_];
    puVar5 = (this->RLC).prows[img_r._4_4_];
    b = 0;
    c = 0;
    ERA_r._4_4_ = 0;
    for (ERA_r._0_4_ = 0; (int)ERA_r < iVar3; ERA_r._0_4_ = (int)ERA_r + 1) {
      uVar1 = puVar9[(int)ERA_r];
      uVar8 = (uint)(uVar1 != '\0') ^ b;
      puVar5[(int)ERA_r._4_4_] = (int)ERA_r - c;
      c = c ^ uVar8;
      ERA_r._4_4_ = ERA_r._4_4_ + uVar8;
      puVar4[(int)ERA_r] = ERA_r._4_4_;
      b = (uint)(uVar1 != '\0');
    }
    puVar5[(int)ERA_r._4_4_] = iVar3 - c;
    this->ner[img_r._4_4_] = ERA_r._4_4_ + b;
    (this->RLC).prows[img_r._4_4_ + 1] = puVar5 + (long)(int)(ERA_r._4_4_ + b) + 1;
  }
  TTA::Setup();
  memset(*(this->ERA).prows,0,(long)(iVar2 * (iVar3 + 1)) << 2);
  puVar4 = *(this->ERA).prows;
  for (ERA_r_1._4_4_ = 1; ERA_r_1._4_4_ <= *this->ner; ERA_r_1._4_4_ = ERA_r_1._4_4_ + 2) {
    uVar8 = TTA::NewLabel();
    puVar4[ERA_r_1._4_4_] = uVar8;
  }
  for (ERA_r_1._0_4_ = 1; (int)ERA_r_1 < iVar2; ERA_r_1._0_4_ = (int)ERA_r_1 + 1) {
    puVar4 = (this->ERA).prows[(int)ERA_r_1];
    puVar5 = (this->ERA).prows[(int)ERA_r_1 + -1];
    puVar6 = (this->ER).prows[(int)ERA_r_1 + -1];
    puVar7 = (this->RLC).prows[(int)ERA_r_1];
    for (j1 = 1; j1 <= this->ner[(int)ERA_r_1]; j1 = j1 + 2) {
      er0 = puVar7[j1 + -1];
      er1 = puVar7[j1];
      if (0 < er0) {
        er0 = er0 - 1;
      }
      if (er1 < iVar3 + -1) {
        er1 = er1 + 1;
      }
      ea = puVar6[er0];
      a = puVar6[er1];
      if (ea % 2 == 0) {
        ea = ea + 1;
      }
      if (a % 2 == 0) {
        a = a - 1;
      }
      if (a < ea) {
        uVar8 = TTA::NewLabel();
        puVar4[j1] = uVar8;
      }
      else {
        eak = TTA::FindRoot(puVar5[ea]);
        while (ak = ea + 2, ak <= a) {
          uVar8 = TTA::FindRoot(puVar5[ak]);
          if (eak < (int)uVar8) {
            TTA::UpdateTable(uVar8,eak);
          }
          ea = ak;
          if ((int)uVar8 < eak) {
            TTA::UpdateTable(eak,uVar8);
            eak = uVar8;
          }
        }
        puVar4[j1] = eak;
      }
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        int rows = img_.rows;
        int cols = img_.cols;

        // Step 1
        for (int r = 0; r < rows; ++r) {
            // Get pointers to rows
            const unsigned char* img_r = img_.ptr<unsigned char>(r);
            unsigned* ER_r = ER.prows[r];
            unsigned* RLC_r = RLC.prows[r];
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c) {
                x0 = img_r[c] > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC_r[er] = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER_r[c] = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC_r[er] = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
            // Compact RLC usage
            RLC.prows[r + 1] = RLC_r + er + 1;
        }